

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vad_filterbank.c
# Opt level: O2

int16_t WebRtcVad_CalculateFeatures
                  (VadInstT *self,int16_t *data_in,size_t data_length,int16_t *features)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  size_t i;
  int16_t iVar5;
  ulong uVar6;
  ulong data_length_00;
  int16_t total_energy;
  int16_t lp_60 [60];
  int16_t hp_60 [60];
  int16_t hp_120 [120];
  int16_t lp_120 [120];
  
  total_energy = 0;
  if (data_length < 0xf1) {
    SplitFilter(data_in,data_length,self->upper_state,self->lower_state,hp_120,lp_120);
    SplitFilter(hp_120,data_length >> 1,self->upper_state + 1,self->lower_state + 1,hp_60,lp_60);
    uVar6 = data_length >> 2;
    LogOfEnergy(hp_60,uVar6,0xb0,&total_energy,features + 5);
    LogOfEnergy(lp_60,uVar6,0xb0,&total_energy,features + 4);
    SplitFilter(lp_120,data_length >> 1,self->upper_state + 2,self->lower_state + 2,hp_60,lp_60);
    LogOfEnergy(hp_60,uVar6,0xb0,&total_energy,features + 3);
    SplitFilter(lp_60,uVar6,self->upper_state + 3,self->lower_state + 3,hp_120,lp_120);
    LogOfEnergy(hp_120,data_length >> 3,0x110,&total_energy,features + 2);
    SplitFilter(lp_120,data_length >> 3,self->upper_state + 4,self->lower_state + 4,hp_60,lp_60);
    data_length_00 = data_length >> 4;
    LogOfEnergy(hp_60,data_length_00,0x170,&total_energy,features + 1);
    for (uVar6 = 0; data_length_00 != uVar6; uVar6 = uVar6 + 1) {
      sVar1 = lp_60[uVar6];
      sVar2 = self->hp_filter_state[0];
      sVar3 = self->hp_filter_state[1];
      self->hp_filter_state[1] = sVar2;
      self->hp_filter_state[0] = sVar1;
      sVar4 = self->hp_filter_state[3];
      self->hp_filter_state[3] = self->hp_filter_state[2];
      iVar5 = (int16_t)((uint)(((int)sVar3 + (int)sVar1) * 0x19e7 +
                               self->hp_filter_state[2] * 0x1e4c + sVar2 * 0x3fffcc32 +
                              sVar4 * 0x3fffea0c) >> 0xe);
      self->hp_filter_state[2] = iVar5;
      hp_120[uVar6] = iVar5;
    }
    LogOfEnergy(hp_120,data_length_00,0x170,&total_energy,features);
    return total_energy;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/common_audio/vad/vad_filterbank.c"
          ,0x106,"DCHECK failed: (data_length) <= (240)");
  exit(1);
}

Assistant:

int16_t WebRtcVad_CalculateFeatures(VadInstT* self, const int16_t* data_in,
                                    size_t data_length, int16_t* features) {
  int16_t total_energy = 0;
  // We expect `data_length` to be 80, 160 or 240 samples, which corresponds to
  // 10, 20 or 30 ms in 8 kHz. Therefore, the intermediate downsampled data will
  // have at most 120 samples after the first split and at most 60 samples after
  // the second split.
  int16_t hp_120[120], lp_120[120];
  int16_t hp_60[60], lp_60[60];
  const size_t half_data_length = data_length >> 1;
  size_t length = half_data_length;  // `data_length` / 2, corresponds to
                                     // bandwidth = 2000 Hz after downsampling.

  // Initialize variables for the first SplitFilter().
  int frequency_band = 0;
  const int16_t* in_ptr = data_in;  // [0 - 4000] Hz.
  int16_t* hp_out_ptr = hp_120;  // [2000 - 4000] Hz.
  int16_t* lp_out_ptr = lp_120;  // [0 - 2000] Hz.

  RTC_DCHECK_LE(data_length, 240);
  RTC_DCHECK_LT(4, kNumChannels - 1);  // Checking maximum `frequency_band`.

  // Split at 2000 Hz and downsample.
  SplitFilter(in_ptr, data_length, &self->upper_state[frequency_band],
              &self->lower_state[frequency_band], hp_out_ptr, lp_out_ptr);

  // For the upper band (2000 Hz - 4000 Hz) split at 3000 Hz and downsample.
  frequency_band = 1;
  in_ptr = hp_120;  // [2000 - 4000] Hz.
  hp_out_ptr = hp_60;  // [3000 - 4000] Hz.
  lp_out_ptr = lp_60;  // [2000 - 3000] Hz.
  SplitFilter(in_ptr, length, &self->upper_state[frequency_band],
              &self->lower_state[frequency_band], hp_out_ptr, lp_out_ptr);

  // Energy in 3000 Hz - 4000 Hz.
  length >>= 1;  // `data_length` / 4 <=> bandwidth = 1000 Hz.

  LogOfEnergy(hp_60, length, kOffsetVector[5], &total_energy, &features[5]);

  // Energy in 2000 Hz - 3000 Hz.
  LogOfEnergy(lp_60, length, kOffsetVector[4], &total_energy, &features[4]);

  // For the lower band (0 Hz - 2000 Hz) split at 1000 Hz and downsample.
  frequency_band = 2;
  in_ptr = lp_120;  // [0 - 2000] Hz.
  hp_out_ptr = hp_60;  // [1000 - 2000] Hz.
  lp_out_ptr = lp_60;  // [0 - 1000] Hz.
  length = half_data_length;  // `data_length` / 2 <=> bandwidth = 2000 Hz.
  SplitFilter(in_ptr, length, &self->upper_state[frequency_band],
              &self->lower_state[frequency_band], hp_out_ptr, lp_out_ptr);

  // Energy in 1000 Hz - 2000 Hz.
  length >>= 1;  // `data_length` / 4 <=> bandwidth = 1000 Hz.
  LogOfEnergy(hp_60, length, kOffsetVector[3], &total_energy, &features[3]);

  // For the lower band (0 Hz - 1000 Hz) split at 500 Hz and downsample.
  frequency_band = 3;
  in_ptr = lp_60;  // [0 - 1000] Hz.
  hp_out_ptr = hp_120;  // [500 - 1000] Hz.
  lp_out_ptr = lp_120;  // [0 - 500] Hz.
  SplitFilter(in_ptr, length, &self->upper_state[frequency_band],
              &self->lower_state[frequency_band], hp_out_ptr, lp_out_ptr);

  // Energy in 500 Hz - 1000 Hz.
  length >>= 1;  // `data_length` / 8 <=> bandwidth = 500 Hz.
  LogOfEnergy(hp_120, length, kOffsetVector[2], &total_energy, &features[2]);

  // For the lower band (0 Hz - 500 Hz) split at 250 Hz and downsample.
  frequency_band = 4;
  in_ptr = lp_120;  // [0 - 500] Hz.
  hp_out_ptr = hp_60;  // [250 - 500] Hz.
  lp_out_ptr = lp_60;  // [0 - 250] Hz.
  SplitFilter(in_ptr, length, &self->upper_state[frequency_band],
              &self->lower_state[frequency_band], hp_out_ptr, lp_out_ptr);

  // Energy in 250 Hz - 500 Hz.
  length >>= 1;  // `data_length` / 16 <=> bandwidth = 250 Hz.
  LogOfEnergy(hp_60, length, kOffsetVector[1], &total_energy, &features[1]);

  // Remove 0 Hz - 80 Hz, by high pass filtering the lower band.
  HighPassFilter(lp_60, length, self->hp_filter_state, hp_120);

  // Energy in 80 Hz - 250 Hz.
  LogOfEnergy(hp_120, length, kOffsetVector[0], &total_energy, &features[0]);

  return total_energy;
}